

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIf.c
# Opt level: O3

int Gia_ManFromIfLogicFindLut
              (If_Man_t *pIfMan,Gia_Man_t *pNew,If_Cut_t *pCutBest,sat_solver *pSat,
              Vec_Int_t *vLeaves,Vec_Int_t *vLits,Vec_Int_t *vCover,Vec_Int_t *vMapping,
              Vec_Int_t *vMapping2,Vec_Int_t *vPacking)

{
  byte bVar1;
  word *pwVar2;
  Vec_Mem_t *pVVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  word *pwVar7;
  byte bVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  int *piVar13;
  ulong uVar14;
  int iVar15;
  uint uVar16;
  word uFree;
  word uBound;
  int pVarsS [15];
  int pVarsB [15];
  int pVarsF [15];
  
  iVar15 = *pIfMan->pPars->pLutStruct + -0x30;
  if (vLeaves->nSize <= iVar15) {
    uVar6 = pCutBest->iCutFunc;
    if ((int)uVar6 < 0) {
      __assert_fail("pCut->iCutFunc >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/if/if.h"
                    ,0x1aa,"word *If_CutTruthW(If_Man_t *, If_Cut_t *)");
    }
    pwVar2 = pIfMan->puTempW;
    pVVar3 = pIfMan->vTtMem[(byte)pCutBest->field_0x1f];
    if (pVVar3 == (Vec_Mem_t *)0x0) {
      pwVar7 = (word *)0x0;
    }
    else {
      uVar5 = uVar6 >> 1;
      if (pVVar3->nEntries <= (int)uVar5) {
LAB_006beba8:
        __assert_fail("i >= 0 && i < p->nEntries",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecMem.h"
                      ,0xc9,"word *Vec_MemReadEntry(Vec_Mem_t *, int)");
      }
      pwVar7 = pVVar3->ppPages[uVar5 >> ((byte)pVVar3->LogPageSze & 0x1f)] +
               (ulong)(uVar5 & pVVar3->PageMask) * (long)pVVar3->nEntrySize;
    }
    uVar5 = pIfMan->nTruth6Words[(byte)pCutBest->field_0x1f];
    if ((uVar6 & 1) == 0) {
      if (0 < (int)uVar5) {
        uVar9 = 0;
        do {
          pwVar2[uVar9] = pwVar7[uVar9];
          uVar9 = uVar9 + 1;
        } while (uVar5 != uVar9);
      }
    }
    else if (0 < (int)uVar5) {
      uVar9 = 0;
      do {
        pwVar2[uVar9] = ~pwVar7[uVar9];
        uVar9 = uVar9 + 1;
      } while (uVar5 != uVar9);
    }
    uVar6 = Gia_ManFromIfLogicCreateLut(pNew,pwVar2,vLeaves,vCover,vMapping,vMapping2);
    if ((int)uVar6 < 0) goto LAB_006bedbb;
    uVar5 = uVar6 >> 1;
    if (pNew->nObjs <= (int)uVar5) {
      __assert_fail("v >= 0 && v < p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                    ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
    }
    if (uVar6 < 2) {
      return uVar6;
    }
    if (((uint)*(undefined8 *)(pNew->pObjs + uVar5) & 0x9fffffff) == 0x9fffffff) {
      return uVar6;
    }
    Vec_IntPush(vPacking,1);
    goto LAB_006bec62;
  }
  uVar6 = pCutBest->iCutFunc;
  if ((int)uVar6 < 0) {
LAB_006beb6a:
    __assert_fail("pCut->iCutFunc >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/if/if.h"
                  ,0x1a6,"int If_CutTruthLit(If_Cut_t *)");
  }
  uVar5 = pIfMan->vTtDsds[(byte)pCutBest->field_0x1f]->pArray[uVar6 >> 1];
  if ((int)uVar5 < 0) {
LAB_006beb89:
    __assert_fail("Lit >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                  ,0x10f,"int Abc_LitNotCond(int, int)");
  }
  uVar5 = If_DsdManSuppSize(pIfMan->pIfDsdMan,uVar5 ^ uVar6 & 1);
  uVar6 = *(uint *)&pCutBest->field_0x1c;
  uVar10 = uVar6 >> 0x18;
  if (uVar5 != uVar10) {
    __assert_fail("If_DsdManSuppSize(pIfMan->pIfDsdMan, If_CutDsdLit(pIfMan, pCutBest)) == (int)pCutBest->nLeaves"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaIf.c"
                  ,0x583,
                  "int Gia_ManFromIfLogicFindLut(If_Man_t *, Gia_Man_t *, If_Cut_t *, sat_solver *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                 );
  }
  if (pIfMan->pPars->fDelayOptLut == 0) {
    uVar6 = pCutBest->iCutFunc;
    if ((int)uVar6 < 0) goto LAB_006beb6a;
    uVar5 = pIfMan->vTtDsds[uVar5]->pArray[uVar6 >> 1];
    if ((int)uVar5 < 0) goto LAB_006beb89;
    uVar5 = If_DsdManCheckXY(pIfMan->pIfDsdMan,uVar5 ^ uVar6 & 1,iVar15,1,0,1,0);
    uVar6 = *(uint *)&pCutBest->field_0x1c;
    uVar10 = uVar6 >> 0x18;
  }
  else {
    uVar5 = pCutBest->uMaskFunc;
  }
  uVar11 = pCutBest->iCutFunc;
  if ((int)uVar11 < 0) goto LAB_006bedbb;
  uVar9 = (ulong)uVar10;
  uVar16 = uVar11 >> 1;
  uVar14 = 6;
  if (6 < uVar10) {
    uVar14 = (ulong)uVar10;
  }
  if (pIfMan->vTtPerms[uVar9]->nSize <= (int)(uVar14 * uVar16)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecStr.h"
                  ,0x175,"char *Vec_StrEntryP(Vec_Str_t *, int)");
  }
  uVar10 = 0;
  if (0xffffff < uVar6) {
    bVar8 = 0;
    uVar12 = 0;
    uVar10 = 0;
    do {
      bVar1 = pIfMan->vTtPerms[uVar9]->pArray[uVar12 + uVar14 * uVar16];
      if ((char)bVar1 < '\0') goto LAB_006bedbb;
      bVar1 = bVar1 >> 1;
      switch(uVar5 >> (bVar8 & 0x1f) & 3) {
      case 1:
        uVar10 = uVar10 | 1 << ((uint)bVar1 * 2 & 0x1f);
        break;
      case 2:
        __assert_fail("Value == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaIf.c"
                      ,0x594,
                      "int Gia_ManFromIfLogicFindLut(If_Man_t *, Gia_Man_t *, If_Cut_t *, sat_solver *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                     );
      case 3:
        uVar10 = uVar10 | 3 << (bVar1 * '\x02' & 0x1f);
      }
      uVar12 = uVar12 + 1;
      bVar8 = bVar8 + 2;
    } while (uVar9 != uVar12);
  }
  pwVar2 = pIfMan->puTempW;
  pVVar3 = pIfMan->vTtMem[uVar9];
  if (pVVar3 == (Vec_Mem_t *)0x0) {
    pwVar7 = (word *)0x0;
  }
  else {
    if (pVVar3->nEntries <= (int)uVar16) goto LAB_006beba8;
    pwVar7 = pVVar3->ppPages[uVar16 >> ((byte)pVVar3->LogPageSze & 0x1f)] +
             (ulong)(uVar16 & pVVar3->PageMask) * (long)pVVar3->nEntrySize;
  }
  uVar6 = pIfMan->nTruth6Words[uVar9];
  if ((uVar11 & 1) == 0) {
    if (0 < (int)uVar6) {
      uVar9 = 0;
      do {
        pwVar2[uVar9] = pwVar7[uVar9];
        uVar9 = uVar9 + 1;
      } while (uVar6 != uVar9);
    }
  }
  else if (0 < (int)uVar6) {
    uVar9 = 0;
    do {
      pwVar2[uVar9] = ~pwVar7[uVar9];
      uVar9 = uVar9 + 1;
    } while (uVar6 != uVar9);
  }
  iVar15 = If_ManSatCheckXY(pSat,iVar15,pwVar2,(uint)(byte)pCutBest->field_0x1f,uVar10,&uBound,
                            &uFree,vLits);
  if (iVar15 == 0) {
    __assert_fail("RetValue",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaIf.c"
                  ,0x597,
                  "int Gia_ManFromIfLogicFindLut(If_Man_t *, Gia_Man_t *, If_Cut_t *, sat_solver *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                 );
  }
  uVar6 = *(uint *)&pCutBest->field_0x1c;
  if (0xffffff < uVar6) {
    uVar11 = 0;
    uVar12 = 0;
    uVar5 = 0;
    uVar14 = 0;
    bVar8 = 0;
    uVar9 = uVar12;
    switch(uVar10 & 3) {
    case 1:
      goto switchD_006beb49_caseD_1;
    case 2:
switchD_006beb49_caseD_2:
      __assert_fail("Value == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaIf.c"
                    ,0x5a2,
                    "int Gia_ManFromIfLogicFindLut(If_Man_t *, Gia_Man_t *, If_Cut_t *, sat_solver *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                   );
    case 3:
      goto switchD_006beb49_caseD_3;
    }
switchD_006beb49_caseD_0:
    uVar9 = uVar14;
    piVar13 = pVarsF;
    uVar14 = (ulong)((int)uVar9 + 1);
    do {
      piVar13[(int)uVar9] = uVar11;
      uVar11 = uVar11 + 1;
      if (uVar6 >> 0x18 == uVar11) {
        vLits->nSize = 0;
        bVar4 = 0 < (int)uVar12;
        if (0 < (int)uVar12) {
          uVar9 = 0;
          goto LAB_006bee4d;
        }
        bVar4 = false;
        goto LAB_006bee83;
      }
      bVar8 = bVar8 + 2;
      uVar9 = uVar12;
      switch(uVar10 >> (bVar8 & 0x1f) & 3) {
      case 0:
        goto switchD_006beb49_caseD_0;
      case 1:
switchD_006beb49_caseD_1:
        uVar9 = (ulong)uVar5;
        uVar5 = uVar5 + 1;
        piVar13 = pVarsB;
        break;
      case 2:
        goto switchD_006beb49_caseD_2;
      case 3:
switchD_006beb49_caseD_3:
        piVar13 = pVarsS;
        uVar12 = (ulong)((int)uVar9 + 1);
      }
    } while( true );
  }
  vLits->nSize = 0;
  uVar12 = 0;
  uVar6 = 0;
  bVar4 = false;
  goto LAB_006beca7;
  while( true ) {
    Vec_IntPush(vLits,vLeaves->pArray[iVar15]);
    uVar9 = uVar9 + 1;
    if (uVar12 == uVar9) break;
LAB_006bee4d:
    iVar15 = pVarsS[uVar9];
    if (((long)iVar15 < 0) || (vLeaves->nSize <= iVar15)) goto LAB_006beec9;
  }
LAB_006bee83:
  uVar6 = (uint)uVar14;
  if (0 < (int)uVar5) {
    uVar9 = 0;
    do {
      iVar15 = pVarsB[uVar9];
      if (((long)iVar15 < 0) || (vLeaves->nSize <= iVar15)) goto LAB_006beec9;
      Vec_IntPush(vLits,vLeaves->pArray[iVar15]);
      uVar9 = uVar9 + 1;
    } while (uVar5 != uVar9);
  }
LAB_006beca7:
  uVar5 = Gia_ManFromIfLogicCreateLut(pNew,&uBound,vLits,vCover,vMapping,vMapping2);
  vLits->nSize = 0;
  Vec_IntPush(vLits,uVar5);
  if (bVar4) {
    uVar9 = 0;
    do {
      iVar15 = pVarsS[uVar9];
      if (((long)iVar15 < 0) || (vLeaves->nSize <= iVar15)) goto LAB_006beec9;
      Vec_IntPush(vLits,vLeaves->pArray[iVar15]);
      uVar9 = uVar9 + 1;
    } while (uVar12 != uVar9);
  }
  if (0 < (int)uVar6) {
    uVar9 = 0;
    do {
      iVar15 = pVarsF[uVar9];
      if (((long)iVar15 < 0) || (vLeaves->nSize <= iVar15)) {
LAB_006beec9:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      Vec_IntPush(vLits,vLeaves->pArray[iVar15]);
      uVar9 = uVar9 + 1;
    } while (uVar6 != uVar9);
  }
  uVar6 = Gia_ManFromIfLogicCreateLut(pNew,&uFree,vLits,vCover,vMapping,vMapping2);
  Vec_IntPush(vPacking,2);
  if (((int)uVar5 < 0) || (Vec_IntPush(vPacking,uVar5 >> 1), (int)uVar6 < 0)) {
LAB_006bedbb:
    __assert_fail("Lit >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                  ,0x10c,"int Abc_Lit2Var(int)");
  }
  uVar5 = uVar6 >> 1;
LAB_006bec62:
  Vec_IntPush(vPacking,uVar5);
  if (0 < vPacking->nSize) {
    *vPacking->pArray = *vPacking->pArray + 1;
    return uVar6;
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                ,0x1d1,"int Vec_IntAddToEntry(Vec_Int_t *, int, int)");
}

Assistant:

int Gia_ManFromIfLogicFindLut( If_Man_t * pIfMan, Gia_Man_t * pNew, If_Cut_t * pCutBest, sat_solver * pSat, Vec_Int_t * vLeaves, Vec_Int_t * vLits, Vec_Int_t * vCover, Vec_Int_t * vMapping, Vec_Int_t * vMapping2, Vec_Int_t * vPacking )
{
    word uBound, uFree;
    int nLutSize = (int)(pIfMan->pPars->pLutStruct[0] - '0');
    int nVarsF = 0, pVarsF[IF_MAX_FUNC_LUTSIZE];
    int nVarsB = 0, pVarsB[IF_MAX_FUNC_LUTSIZE];
    int nVarsS = 0, pVarsS[IF_MAX_FUNC_LUTSIZE];
    unsigned uSetNew, uSetOld;
    int RetValue, RetValue2, k;
    char * pPerm;
    if ( Vec_IntSize(vLeaves) <= nLutSize )
    {
        RetValue = Gia_ManFromIfLogicCreateLut( pNew, If_CutTruthW(pIfMan, pCutBest), vLeaves, vCover, vMapping, vMapping2 );
        // write packing
        if ( !Gia_ObjIsCi(Gia_ManObj(pNew, Abc_Lit2Var(RetValue))) && RetValue > 1 )
        {
            Vec_IntPush( vPacking, 1 );
            Vec_IntPush( vPacking, Abc_Lit2Var(RetValue) );
            Vec_IntAddToEntry( vPacking, 0, 1 );
        }
        return RetValue;
    }
    assert( If_DsdManSuppSize(pIfMan->pIfDsdMan, If_CutDsdLit(pIfMan, pCutBest)) == (int)pCutBest->nLeaves );
    // find the bound set
    if ( pIfMan->pPars->fDelayOptLut )
        uSetOld = pCutBest->uMaskFunc;
    else
        uSetOld = If_DsdManCheckXY( pIfMan->pIfDsdMan, If_CutDsdLit(pIfMan, pCutBest), nLutSize, 1, 0, 1, 0 );
    // remap bound set
    uSetNew = 0;
    pPerm = If_CutDsdPerm( pIfMan, pCutBest );
    for ( k = 0; k < If_CutLeaveNum(pCutBest); k++ )
    {
        int iVar = Abc_Lit2Var((int)pPerm[k]);
        int Value = ((uSetOld >> (k << 1)) & 3);
        if ( Value == 1 )
            uSetNew |= (1 << (2*iVar));
        else if ( Value == 3 )
            uSetNew |= (3 << (2*iVar));
        else assert( Value == 0 );
    }
    RetValue = If_ManSatCheckXY( pSat, nLutSize, If_CutTruthW(pIfMan, pCutBest), pCutBest->nLeaves, uSetNew, &uBound, &uFree, vLits );
    assert( RetValue );
    // collect variables
    for ( k = 0; k < If_CutLeaveNum(pCutBest); k++ )
    {
        int Value = ((uSetNew >> (k << 1)) & 3);
        if ( Value == 0 )
            pVarsF[nVarsF++] = k;
        else if ( Value == 1 )
            pVarsB[nVarsB++] = k;
        else if ( Value == 3 )
            pVarsS[nVarsS++] = k;
        else assert( Value == 0 );
    }
    // collect bound set variables
    Vec_IntClear( vLits );
    for ( k = 0; k < nVarsS; k++ )
        Vec_IntPush( vLits, Vec_IntEntry(vLeaves, pVarsS[k]) );
    for ( k = 0; k < nVarsB; k++ )
        Vec_IntPush( vLits, Vec_IntEntry(vLeaves, pVarsB[k]) );
    RetValue = Gia_ManFromIfLogicCreateLut( pNew, &uBound, vLits, vCover, vMapping, vMapping2 );
    // collecct free set variables
    Vec_IntClear( vLits );
    Vec_IntPush( vLits, RetValue );
    for ( k = 0; k < nVarsS; k++ )
        Vec_IntPush( vLits, Vec_IntEntry(vLeaves, pVarsS[k]) );
    for ( k = 0; k < nVarsF; k++ )
        Vec_IntPush( vLits, Vec_IntEntry(vLeaves, pVarsF[k]) );
    // add packing
    RetValue2 = Gia_ManFromIfLogicCreateLut( pNew, &uFree, vLits, vCover, vMapping, vMapping2 );
    // write packing
    Vec_IntPush( vPacking, 2 );
    Vec_IntPush( vPacking, Abc_Lit2Var(RetValue) );
    Vec_IntPush( vPacking, Abc_Lit2Var(RetValue2) );
    Vec_IntAddToEntry( vPacking, 0, 1 );
    return RetValue2;
}